

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cc
# Opt level: O2

double __thiscall Generator::MeanLogGuesses(Generator *this,char *puzzle)

{
  int iVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  char *pcVar4;
  int iVar5;
  double dVar6;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  size_t guesses;
  double local_90;
  char solution [81];
  
  local_90 = 0.0;
  iVar5 = 0;
  while( true ) {
    iVar1 = (this->options_).num_evals;
    if (iVar1 <= iVar5) {
      return (double)((ulong)(iVar1 != 0) * (long)(local_90 / (double)iVar1));
    }
    Util::PermuteSudoku(&this->util_,puzzle,(this->options_).pencilmark);
    guesses = 0;
    iVar1 = (this->options_).solver;
    if (iVar1 == 2) break;
    if (iVar1 == 1) {
      pcVar4 = "Must build with -DMINISAT=on to use minisat";
      goto LAB_001044cd;
    }
    TdokuSolverDpllTriadSimd(puzzle,1,0,solution,&guesses);
    auVar2._8_8_ = in_XMM2_Qb;
    auVar2._0_8_ = in_XMM2_Qa;
    auVar2 = vcvtusi2sd_avx512f(auVar2,guesses);
    dVar6 = log(auVar2._0_8_ + 1.0);
    iVar5 = iVar5 + 1;
    local_90 = local_90 + dVar6;
  }
  pcVar4 = "Must build with -DGUROBI=on to use gurobi";
LAB_001044cd:
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

double MeanLogGuesses(char *puzzle) {
        char solution[81];
        double sum_log_guesses = 0.0;
        for (int j = 0; j < options_.num_evals; j++) {
            util_.PermuteSudoku(puzzle, options_.pencilmark);
            size_t guesses = 0;
            if (options_.solver == 1) {
#ifdef MINISAT
                OtherSolverMiniSat(puzzle, 1, 3, solution, &guesses);
#else
                cout << "Must build with -DMINISAT=on to use minisat" << endl;
                exit(1);
#endif
            } else if (options_.solver == 2) {
#ifdef GUROBI
                OtherSolverGurobi(puzzle, 2, 0, solution, &guesses);
#else
                cout << "Must build with -DGUROBI=on to use gurobi" << endl;
                exit(1);
#endif
            } else {
                TdokuSolverDpllTriadSimd(puzzle, 1, 0, solution, &guesses);
            }
            sum_log_guesses += log((double) guesses + 1);
        }
        return options_.num_evals == 0 ? 0.0 : sum_log_guesses / options_.num_evals;
    }